

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O1

void __thiscall Assimp::Logger::debug(Logger *this,char *message)

{
  size_t sVar1;
  
  sVar1 = strlen(message);
  if (0x400 < sVar1) {
    return;
  }
  (*this->_vptr_Logger[4])(this,message);
  return;
}

Assistant:

void Logger::debug(const char* message) {

    // SECURITY FIX: otherwise it's easy to produce overruns since
    // sometimes importers will include data from the input file
    // (i.e. node names) in their messages.
    if (strlen(message)>MAX_LOG_MESSAGE_LENGTH) {
        return;
    }
    return OnDebug(message);
}